

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O1

void gba_read_half_cold_7(void)

{
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x3af);
  fwrite("Unrecognized size in read_half_ioreg!\n\x1b[0;m",0x2b,1,_stderr);
  exit(1);
}

Assistant:

INLINE half inline_gba_read_half(word address, access_type_t access_type) {
    address &= ~(sizeof(half) - 1);
    half region = address >> 24;
    tick_memory_waitstate(access_type, sizeof(half), region);
    switch (region) {
        case REGION_BIOS: {
            if (address < GBA_BIOS_SIZE) { // BIOS
                return gbabios_read_byte(address) | (gbabios_read_byte(address + 1) << 8);
            } else {
                return open_bus(cpu->pc);
            }
        }
        case REGION_EWRAM: {
            word index = (address - 0x02000000) % 0x40000;
            return half_from_byte_array(mem->ewram, index);
        }
        case REGION_IWRAM: {
            word index = (address - 0x03000000) % 0x8000;
            return half_from_byte_array(mem->iwram, index);
        }
        case REGION_IOREG: {
            if (address < 0x04000400) {
                byte size = get_ioreg_size_for_addr(address);
                switch (size) {
                    case 0:
                        logwarn("Returning open bus (UNUSED HALF IOREG 0x%08X)", address)
                        return open_bus(cpu->pc);
                    case sizeof(byte):
                        return read_byte_ioreg(address) | (read_byte_ioreg(address + 1) << 8);
                    case sizeof(half):
                        return read_half_ioreg(address);
                    case sizeof(word): {
                        byte ofs = address % 4;
                        return (read_word_ioreg(address) >> (ofs * 8)) & 0xFFFF;
                        default:
                            logfatal("Unrecognized size in read_half_ioreg!")
                    }
                }
            } else {
#ifdef ENABLE_MGBA_DEBUG
                if (address == 0x4FFF700 || address == 0x4FFF780 || address == 0x4FFF600) {
                    return mgba_debug_read_half(address);
                }
#endif
                logwarn("Tried to read from 0x%08X", address)
                return open_bus(cpu->pc);
            }
        }
        case REGION_PRAM: {
            word index = (address - 0x5000000) % 0x400;
            return half_from_byte_array(ppu->pram, index);
        }
        case REGION_VRAM: {
            word index = (address - 0x06000000) % VRAM_SIZE;
            return half_from_byte_array(ppu->vram, index);
        }
        case REGION_OAM: {
            word index = (address - 0x07000000) % OAM_SIZE;
            return half_from_byte_array(ppu->oam, index);
        }
        case REGION_GAMEPAK0_L:
            if (address >= 0x080000C4 && address <= 0x080000C8 && bus->allow_gpio_read) {
                return gpio_read(address);
            }
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L: {
            word index = address & 0x1FFFFFF;
            if (index < mem->rom_size) {
                return half_from_byte_array(mem->rom, index);
            } else {
                return open_bus(cpu->pc);
            }
        }

        case REGION_GAMEPAK2_H:
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || address >= 0xDFFFF00) {
                    return read_half_eeprom(bus, mem, address);
                }
            }
            word index = address & 0x1FFFFFF;
            if (index < mem->rom_size) {
                return half_from_byte_array(mem->rom, index);
            } else {
                return open_bus(cpu->pc);
            }

        case REGION_SRAM:
            switch (bus->backup_type) {
                case SRAM:
                    return half_from_byte_array(mem->backup, address & 0x7FFF);
                case FLASH64K:
                case FLASH128K:
                    logfatal("gba_read_half from FLASH!")
                default: break;
            }
            return 0;

        case REGION_SRAM_MIRR:
            if (bus->backup_type == SRAM) {
                return half_from_byte_array(mem->backup, address & 0x7FFF);
            }
            return 0;
        default:
            return open_bus(cpu->pc);
    }
}